

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::MasteringMetadata::Valid(MasteringMetadata *this)

{
  bool bVar1;
  MasteringMetadata *this_local;
  
  if (((this->luminance_min_ == 3.4028235e+38) && (!NAN(this->luminance_min_))) ||
     ((0.0 < this->luminance_min_ || this->luminance_min_ == 0.0 &&
      ((this->luminance_min_ <= 999.99 &&
       (this->luminance_min_ < this->luminance_max_ || this->luminance_min_ == this->luminance_max_)
       ))))) {
    if (((this->luminance_max_ == 3.4028235e+38) && (!NAN(this->luminance_max_))) ||
       ((0.0 < this->luminance_max_ || this->luminance_max_ == 0.0 &&
        ((this->luminance_max_ <= 9999.99 && (this->luminance_min_ <= this->luminance_max_)))))) {
      if ((this->r_ == (PrimaryChromaticity *)0x0) ||
         (bVar1 = PrimaryChromaticity::Valid(this->r_), bVar1)) {
        if ((this->g_ == (PrimaryChromaticity *)0x0) ||
           (bVar1 = PrimaryChromaticity::Valid(this->g_), bVar1)) {
          if ((this->b_ == (PrimaryChromaticity *)0x0) ||
             (bVar1 = PrimaryChromaticity::Valid(this->b_), bVar1)) {
            if ((this->white_point_ == (PrimaryChromaticity *)0x0) ||
               (bVar1 = PrimaryChromaticity::Valid(this->white_point_), bVar1)) {
              this_local._7_1_ = true;
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MasteringMetadata::Valid() const {
  if (luminance_min_ != kValueNotPresent) {
    if (luminance_min_ < kMinLuminance || luminance_min_ > kMinLuminanceMax ||
        luminance_min_ > luminance_max_) {
      return false;
    }
  }
  if (luminance_max_ != kValueNotPresent) {
    if (luminance_max_ < kMinLuminance || luminance_max_ > kMaxLuminanceMax ||
        luminance_max_ < luminance_min_) {
      return false;
    }
  }
  if (r_ && !r_->Valid())
    return false;
  if (g_ && !g_->Valid())
    return false;
  if (b_ && !b_->Valid())
    return false;
  if (white_point_ && !white_point_->Valid())
    return false;

  return true;
}